

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall
FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::dump_WaveAudioDescriptor
          (FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *this,FILE *stream)

{
  MDD_t MVar1;
  long *plVar2;
  undefined8 uVar3;
  WaveAudioDescriptor *descriptor;
  Result_t result;
  char buf [64];
  
  ASDCP::DefaultCompositeDict();
  descriptor = (WaveAudioDescriptor *)0x0;
  plVar2 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
  MVar1 = ASDCP::DefaultCompositeDict();
  uVar3 = ASDCP::Dictionary::Type(MVar1);
  (**(code **)(*plVar2 + 0xa8))(&result,plVar2,uVar3,&descriptor);
  if (-1 < _result) {
    uVar3 = ASDCP::UL::EncodeString((char *)(descriptor + 0x1c0),(uint)buf);
    fprintf((FILE *)stream,"ChannelAssignment: %s\n",uVar3);
  }
  Kumu::Result_t::~Result_t(&result);
  return;
}

Assistant:

void dump_WaveAudioDescriptor(FILE* stream = 0)
  {
    const Dictionary& Dict = DefaultCompositeDict();
    MXF::WaveAudioDescriptor *descriptor = 0;

    Result_t result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor),
							      reinterpret_cast<MXF::InterchangeObject**>(&descriptor));

    if ( KM_SUCCESS(result) )
      {
    	char buf[64];
    	fprintf(stream, "ChannelAssignment: %s\n", descriptor->ChannelAssignment.const_get().EncodeString(buf, 64));
      }
  }